

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<char,_std::allocator<char>_>_>::load(BinaryBuffer *bb,Vector *v)

{
  vector<char,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  value_type *unaff_retaddr;
  size_type in_stack_00000008;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar1;
  undefined8 local_18;
  
  load<unsigned_long>((BinaryBuffer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  uVar1 = 0;
  Catch::clara::std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)s,in_stack_00000008,unaff_retaddr);
  if (local_18 != 0) {
    Catch::clara::std::vector<char,_std::allocator<char>_>::operator[](in_RSI,0);
    load<char>((BinaryBuffer *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_RDI,0x272b96);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }